

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O1

BeliefUpperBound * __thiscall despot::BaseTag::CreateBeliefUpperBound(BaseTag *this,string *name)

{
  int iVar1;
  TagManhattanUpperBound *this_00;
  TrivialBeliefUpperBound *this_01;
  ostream *poVar2;
  
  iVar1 = std::__cxx11::string::compare((char *)name);
  if (iVar1 == 0) {
    this_01 = (TrivialBeliefUpperBound *)operator_new(0x10);
    despot::TrivialBeliefUpperBound::TrivialBeliefUpperBound
              (this_01,(DSPOMDP *)&this->super_BeliefMDP);
    return (BeliefUpperBound *)this_01;
  }
  iVar1 = std::__cxx11::string::compare((char *)name);
  if ((iVar1 == 0) || (iVar1 = std::__cxx11::string::compare((char *)name), iVar1 == 0)) {
    this_00 = (TagManhattanUpperBound *)operator_new(0x38);
    despot::MDPUpperBound::MDPUpperBound
              ((MDPUpperBound *)this_00,&this->super_MDP,&this->super_StateIndexer);
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)name);
    if (iVar1 != 0) {
      iVar1 = std::__cxx11::string::compare((char *)name);
      if (iVar1 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Unsupported belief upper bound: ",0x20);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(name->_M_dataplus)._M_p,name->_M_string_length);
        std::endl<char,std::char_traits<char>>(poVar2);
      }
      poVar2 = std::operator<<((ostream *)&std::cerr,
                               "Supported types: TRIVIAL, MDP, MANHATTAN (default to MDP)");
      std::endl<char,std::char_traits<char>>(poVar2);
      exit(1);
    }
    this_00 = (TagManhattanUpperBound *)operator_new(0x30);
    TagManhattanUpperBound::TagManhattanUpperBound(this_00,this);
  }
  return &this_00->super_BeliefUpperBound;
}

Assistant:

BeliefUpperBound* BaseTag::CreateBeliefUpperBound(string name) const {
	if (name == "TRIVIAL") {
		return new TrivialBeliefUpperBound(this);
	} else if (name == "DEFAULT" || name == "MDP") {
		return new MDPUpperBound(this, *this);
	} else if (name == "MANHATTAN") {
		return new TagManhattanUpperBound(this);
	} else {
		if (name != "print")
			cerr << "Unsupported belief upper bound: " << name << endl;
		cerr << "Supported types: TRIVIAL, MDP, MANHATTAN (default to MDP)" << endl;
		exit(1);
		return NULL;
	}
}